

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::load_magick(CImg<unsigned_char> *this,char *filename)

{
  CImgIOException *this_00;
  pointer_____offset_0x10___ *ppuVar1;
  char *pcVar2;
  
  this_00 = (CImgIOException *)__cxa_allocate_exception(0x10);
  pcVar2 = "non-";
  if (this->_is_shared != false) {
    pcVar2 = "";
  }
  if (filename == (char *)0x0) {
    CImgArgumentException::CImgArgumentException
              ((CImgArgumentException *)this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_magick(): Specified filename is (null)."
              );
    ppuVar1 = &CImgArgumentException::typeinfo;
  }
  else {
    CImgIOException::CImgIOException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_magick(): Unable to load file \'%s\' unless libMagick++ is enabled."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar2,"unsigned char",filename);
    ppuVar1 = &CImgIOException::typeinfo;
  }
  __cxa_throw(this_00,ppuVar1,CImgException::~CImgException);
}

Assistant:

CImg<T>& load_magick(const char *const filename) {
      if (!filename)
        throw CImgArgumentException(_cimg_instance
                                    "load_magick(): Specified filename is (null).",
                                    cimg_instance);

#ifdef cimg_use_magick
      Magick::Image image(filename);
      const unsigned int W = image.size().width(), H = image.size().height();
      switch (image.type()) {
      case Magick::PaletteMatteType :
      case Magick::TrueColorMatteType :
      case Magick::ColorSeparationType : {
        assign(W,H,1,4);
        T *ptr_r = data(0,0,0,0), *ptr_g = data(0,0,0,1), *ptr_b = data(0,0,0,2), *ptr_a = data(0,0,0,3);
        Magick::PixelPacket *pixels = image.getPixels(0,0,W,H);
        for (ulongT off = (ulongT)W*H; off; --off) {
          *(ptr_r++) = (T)(pixels->red);
          *(ptr_g++) = (T)(pixels->green);
          *(ptr_b++) = (T)(pixels->blue);
          *(ptr_a++) = (T)(pixels->opacity);
          ++pixels;
        }
      } break;
      case Magick::PaletteType :
      case Magick::TrueColorType : {
        assign(W,H,1,3);
        T *ptr_r = data(0,0,0,0), *ptr_g = data(0,0,0,1), *ptr_b = data(0,0,0,2);
        Magick::PixelPacket *pixels = image.getPixels(0,0,W,H);
        for (ulongT off = (ulongT)W*H; off; --off) {
          *(ptr_r++) = (T)(pixels->red);
          *(ptr_g++) = (T)(pixels->green);
          *(ptr_b++) = (T)(pixels->blue);
          ++pixels;
        }
      } break;
      case Magick::GrayscaleMatteType : {
        assign(W,H,1,2);
        T *ptr_r = data(0,0,0,0), *ptr_a = data(0,0,0,1);
        Magick::PixelPacket *pixels = image.getPixels(0,0,W,H);
        for (ulongT off = (ulongT)W*H; off; --off) {
          *(ptr_r++) = (T)(pixels->red);
          *(ptr_a++) = (T)(pixels->opacity);
          ++pixels;
        }
      } break;
      default : {
        assign(W,H,1,1);
        T *ptr_r = data(0,0,0,0);
        Magick::PixelPacket *pixels = image.getPixels(0,0,W,H);
        for (ulongT off = (ulongT)W*H; off; --off) {
          *(ptr_r++) = (T)(pixels->red);
          ++pixels;
        }
      }
      }
      return *this;
#else
      throw CImgIOException(_cimg_instance
                            "load_magick(): Unable to load file '%s' unless libMagick++ is enabled.",
                            cimg_instance,
                            filename);
#endif
    }